

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualCommand.cpp
# Opt level: O3

void __thiscall EqualCommand::doCommand(EqualCommand *this)

{
  ulong index;
  double dVar1;
  int iVar2;
  unsigned_long uVar3;
  iterator iVar4;
  undefined8 *puVar5;
  long lVar6;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_110;
  undefined1 auStack_d8 [8];
  ExpressionUtils expUtils;
  undefined1 local_b8 [8];
  string varValueStr;
  double varValue;
  undefined1 local_88 [8];
  string varName;
  long local_60;
  
  uVar3 = DataCommands::getIndex(this->dataCommands);
  DataCommands::getSeparated_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&varName.field_2 + 8),this->dataCommands);
  index = uVar3 + 2;
  if (index < (ulong)(local_60 - varName.field_2._8_8_ >> 5)) {
    lVar6 = index * 0x20;
    iVar2 = strcmp(*(char **)(varName.field_2._8_8_ + lVar6),"bind");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&varName.field_2 + 8));
    if (iVar2 == 0) {
      DataCommands::setIndex(this->dataCommands,index);
      return;
    }
    DataCommands::getSeparated_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&varName.field_2 + 8),this->dataCommands);
    if ((ulong)(local_60 - varName.field_2._8_8_ >> 5) <= index) goto LAB_0011b08a;
    local_b8 = (undefined1  [8])&varValueStr._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b8,*(long *)(varName.field_2._8_8_ + lVar6),
               *(long *)(varName.field_2._8_8_ + 8 + lVar6) +
               *(long *)(varName.field_2._8_8_ + lVar6));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&varName.field_2 + 8));
    auStack_d8 = (undefined1  [8])0x0;
    expUtils.deathMap.super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    expUtils.deathMap.super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    DataVars::getSymbolTable_abi_cxx11_
              ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                *)&local_110,this->dataVars);
    dVar1 = ExpressionUtils::calculateInfixStr
                      ((ExpressionUtils *)auStack_d8,(string *)local_b8,
                       (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                        *)&local_110);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_110);
    varValueStr.field_2._8_8_ = dVar1;
    DataCommands::getSeparated_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&varName.field_2 + 8),this->dataCommands);
    if (uVar3 < (ulong)(local_60 - varName.field_2._8_8_ >> 5)) {
      lVar6 = *(long *)(varName.field_2._8_8_ + uVar3 * 0x20);
      local_88 = (undefined1  [8])&varName._M_string_length;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_88,lVar6,
                 *(long *)(varName.field_2._8_8_ + 8 + uVar3 * 0x20) + lVar6);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&varName.field_2 + 8));
      DataVars::getSymbolTable_abi_cxx11_
                ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                  *)((long)&varName.field_2 + 8),this->dataVars);
      iVar4 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)((long)&varName.field_2 + 8),(key_type *)local_88);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)((long)&varName.field_2 + 8));
      DataVars::getSymbolTable_abi_cxx11_
                ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                  *)((long)&varName.field_2 + 8),this->dataVars);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)((long)&varName.field_2 + 8));
      if (iVar4.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
          ._M_cur != (__node_type *)0x0) {
        DataVars::setSymbolTableValue
                  (this->dataVars,(string *)local_88,(double *)((long)&varValueStr.field_2 + 8));
        DataVars::addLastChanged(this->dataVars,(string *)local_88);
        DataCommands::setIndex(this->dataCommands,uVar3 + 3);
        if (local_88 != (undefined1  [8])&varName._M_string_length) {
          operator_delete((void *)local_88,varName._M_string_length + 1);
        }
        ExpressionUtils::~ExpressionUtils((ExpressionUtils *)auStack_d8);
        if (local_b8 == (undefined1  [8])&varValueStr._M_string_length) {
          return;
        }
        operator_delete((void *)local_b8,varValueStr._M_string_length + 1);
        return;
      }
      goto LAB_0011b0ac;
    }
  }
  else {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",index);
LAB_0011b08a:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",index);
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar3);
LAB_0011b0ac:
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = "This var has not been declared before";
  __cxa_throw(puVar5,&char_const*::typeinfo,0);
}

Assistant:

void EqualCommand::doCommand() {
    // get the index from dataCommands
    unsigned long index = this->dataCommands->getIndex();
    // skip the =
    index++;

    // If bind doesn't appear after "="
    if (strcmp(this->dataCommands->getSeparated().at(index + 1).c_str(), "bind") != 0) {
        string varValueStr = this->dataCommands->getSeparated().at(index + 1);
        ExpressionUtils expUtils;
        double varValue = expUtils.calculateInfixStr(varValueStr, this->dataVars->getSymbolTable());
        string varName = this->dataCommands->getSeparated().at(index - 1);

        // Find the relevant var in the table and save its new value
        auto itSymbolTable = this->dataVars->getSymbolTable().find(varName);
        if (itSymbolTable == this->dataVars->getSymbolTable().end()) {
            throw "This var has not been declared before";
        }
        this->dataVars->setSymbolTableValue(varName, varValue);
        // update isChanged and lastChanged
        this->dataVars->addLastChanged(varName);
        index = index + 2;
        // set the new index of dataCommands
        this->dataCommands->setIndex(index);
    } else { // If bind appears after "="
        index++;
        // set the new index of dataCommands
        this->dataCommands->setIndex(index);
    }
}